

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool __thiscall
cmListCommand::InitialPass
          (cmListCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar1;
  string e;
  allocator<char> local_39;
  string local_38;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)__lhs) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"must be called with at least two arguments.",&local_39);
    cmCommand::SetError(&this->super_cmCommand,&local_38);
LAB_001bb013:
    std::__cxx11::string::~string((string *)&local_38);
    bVar1 = false;
  }
  else {
    bVar1 = std::operator==(__lhs,"LENGTH");
    if (bVar1) {
      bVar1 = HandleLengthCommand(this,args);
      return bVar1;
    }
    bVar1 = std::operator==(__lhs,"GET");
    if (bVar1) {
      bVar1 = HandleGetCommand(this,args);
      return bVar1;
    }
    bVar1 = std::operator==(__lhs,"APPEND");
    if (bVar1) {
      HandleAppendCommand(this,args);
    }
    else {
      bVar1 = std::operator==(__lhs,"PREPEND");
      if (bVar1) {
        HandlePrependCommand(this,args);
      }
      else {
        bVar1 = std::operator==(__lhs,"POP_BACK");
        if (bVar1) {
          HandlePopBackCommand(this,args);
        }
        else {
          bVar1 = std::operator==(__lhs,"POP_FRONT");
          if (!bVar1) {
            bVar1 = std::operator==(__lhs,"FIND");
            if (bVar1) {
              bVar1 = HandleFindCommand(this,args);
              return bVar1;
            }
            bVar1 = std::operator==(__lhs,"INSERT");
            if (bVar1) {
              bVar1 = HandleInsertCommand(this,args);
              return bVar1;
            }
            bVar1 = std::operator==(__lhs,"JOIN");
            if (bVar1) {
              bVar1 = HandleJoinCommand(this,args);
              return bVar1;
            }
            bVar1 = std::operator==(__lhs,"REMOVE_AT");
            if (bVar1) {
              bVar1 = HandleRemoveAtCommand(this,args);
              return bVar1;
            }
            bVar1 = std::operator==(__lhs,"REMOVE_ITEM");
            if (bVar1) {
              bVar1 = HandleRemoveItemCommand(this,args);
              return bVar1;
            }
            bVar1 = std::operator==(__lhs,"REMOVE_DUPLICATES");
            if (bVar1) {
              bVar1 = HandleRemoveDuplicatesCommand(this,args);
              return bVar1;
            }
            bVar1 = std::operator==(__lhs,"TRANSFORM");
            if (bVar1) {
              bVar1 = HandleTransformCommand(this,args);
              return bVar1;
            }
            bVar1 = std::operator==(__lhs,"SORT");
            if (bVar1) {
              bVar1 = HandleSortCommand(this,args);
              return bVar1;
            }
            bVar1 = std::operator==(__lhs,"SUBLIST");
            if (bVar1) {
              bVar1 = HandleSublistCommand(this,args);
              return bVar1;
            }
            bVar1 = std::operator==(__lhs,"REVERSE");
            if (bVar1) {
              bVar1 = HandleReverseCommand(this,args);
              return bVar1;
            }
            bVar1 = std::operator==(__lhs,"FILTER");
            if (bVar1) {
              bVar1 = HandleFilterCommand(this,args);
              return bVar1;
            }
            std::operator+(&local_38,"does not recognize sub-command ",__lhs);
            cmCommand::SetError(&this->super_cmCommand,&local_38);
            goto LAB_001bb013;
          }
          HandlePopFrontCommand(this,args);
        }
      }
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool cmListCommand::InitialPass(std::vector<std::string> const& args,
                                cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("must be called with at least two arguments.");
    return false;
  }

  const std::string& subCommand = args[0];
  if (subCommand == "LENGTH") {
    return this->HandleLengthCommand(args);
  }
  if (subCommand == "GET") {
    return this->HandleGetCommand(args);
  }
  if (subCommand == "APPEND") {
    return this->HandleAppendCommand(args);
  }
  if (subCommand == "PREPEND") {
    return this->HandlePrependCommand(args);
  }
  if (subCommand == "POP_BACK") {
    return this->HandlePopBackCommand(args);
  }
  if (subCommand == "POP_FRONT") {
    return this->HandlePopFrontCommand(args);
  }
  if (subCommand == "FIND") {
    return this->HandleFindCommand(args);
  }
  if (subCommand == "INSERT") {
    return this->HandleInsertCommand(args);
  }
  if (subCommand == "JOIN") {
    return this->HandleJoinCommand(args);
  }
  if (subCommand == "REMOVE_AT") {
    return this->HandleRemoveAtCommand(args);
  }
  if (subCommand == "REMOVE_ITEM") {
    return this->HandleRemoveItemCommand(args);
  }
  if (subCommand == "REMOVE_DUPLICATES") {
    return this->HandleRemoveDuplicatesCommand(args);
  }
  if (subCommand == "TRANSFORM") {
    return this->HandleTransformCommand(args);
  }
  if (subCommand == "SORT") {
    return this->HandleSortCommand(args);
  }
  if (subCommand == "SUBLIST") {
    return this->HandleSublistCommand(args);
  }
  if (subCommand == "REVERSE") {
    return this->HandleReverseCommand(args);
  }
  if (subCommand == "FILTER") {
    return this->HandleFilterCommand(args);
  }

  std::string e = "does not recognize sub-command " + subCommand;
  this->SetError(e);
  return false;
}